

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  ITestCase *pIVar1;
  pointer pcVar2;
  
  pIVar1 = (other->m_test).m_p;
  (this->m_test).m_p = pIVar1;
  if (pIVar1 != (ITestCase *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  pcVar2 = (other->m_className)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_className,pcVar2,pcVar2 + (other->m_className)._M_string_length);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (other->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + (other->m_name)._M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar2 = (other->m_description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar2,pcVar2 + (other->m_description)._M_string_length)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->m_tags)._M_t,&(other->m_tags)._M_t);
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)&(this->m_lineInfo).file.field_2;
  pcVar2 = (other->m_lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_lineInfo,pcVar2,pcVar2 + (other->m_lineInfo).file._M_string_length);
  (this->m_lineInfo).line = (other->m_lineInfo).line;
  this->m_isHidden = other->m_isHidden;
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( const TestCaseInfo& other )
    :   m_test( other.m_test ),
        m_className( other.m_className ),
        m_name( other.m_name ),
        m_description( other.m_description ),
        m_tags( other.m_tags ),
        m_lineInfo( other.m_lineInfo ),
        m_isHidden( other.m_isHidden )
    {}